

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryKinematicsModelsLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryKinematicsModelsLoader::begin__kinematics_model
          (LibraryKinematicsModelsLoader *this,kinematics_model__AttributeData *attributeData)

{
  URI *this_00;
  SidTreeNode *val;
  long *in_RSI;
  long *in_RDI;
  SidTreeNode *sidTreeNode;
  char *name;
  URI uri;
  String *in_stack_fffffffffffffe98;
  URI *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  IFilePartLoader *in_stack_fffffffffffffeb0;
  allocator<char> *in_stack_fffffffffffffed0;
  URI *in_stack_fffffffffffffed8;
  KinematicsModel *in_stack_fffffffffffffee0;
  string local_118 [63];
  undefined1 in_stack_ffffffffffffff27;
  URI *in_stack_ffffffffffffff28;
  URI *in_stack_ffffffffffffff30;
  
  (**(code **)(*in_RDI + 0x58))();
  COLLADABU::URI::URI(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                      (bool)in_stack_ffffffffffffff27);
  if (*in_RSI != 0) {
    in_stack_fffffffffffffea8 = (char *)*in_RSI;
    in_stack_fffffffffffffeb0 = (IFilePartLoader *)&stack0xfffffffffffffee7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0
              );
    COLLADABU::URI::setFragment(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffee7);
  }
  this_00 = (URI *)operator_new(0x130);
  KinematicsModel::KinematicsModel
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
  in_RDI[0x35] = (long)this_00;
  val = IFilePartLoader::addToSidTree
                  (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(char *)this_00,
                   (IntermediateTargetable *)in_stack_fffffffffffffe98);
  KinematicsModel::setSidTreeNode((KinematicsModel *)in_RDI[0x35],val);
  COLLADABU::URI::~URI(this_00);
  return true;
}

Assistant:

bool LibraryKinematicsModelsLoader::begin__kinematics_model( const kinematics_model__AttributeData& attributeData )
	{
		COLLADABU::URI uri(getFileUri());
		if ( attributeData.id )
		{
			uri.setFragment( attributeData.id );
		}

		const char* name = 0;
		if ( attributeData.name )
		{
			name = attributeData.name;
		}
		else if ( attributeData.id )
		{
			name = attributeData.id;
		}

		mCurrentKinematicsModel = new KinematicsModel(uri, name);
		SidTreeNode* sidTreeNode = addToSidTree( attributeData.id, 0, mCurrentKinematicsModel);
		mCurrentKinematicsModel->setSidTreeNode(sidTreeNode);
		return true;
	}